

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::flipAllBitsSlowCase(APInt *this)

{
  tcComplement((this->U).pVal,(uint)((ulong)this->BitWidth + 0x3f >> 6));
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::flipAllBitsSlowCase() {
  tcComplement(U.pVal, getNumWords());
  clearUnusedBits();
}